

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmem.c
# Opt level: O1

void * luaM_growaux_(lua_State *L,void *block,int *size,size_t size_elems,int limit,char *errormsg)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  void *pvVar4;
  
  iVar1 = *size;
  if (iVar1 < limit / 2) {
    limit = 4;
    if (4 < iVar1 * 2) {
      limit = iVar1 * 2;
    }
  }
  else if (limit <= iVar1) {
    luaG_runerror(L,errormsg);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = size_elems;
  auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0xfffffffffffffffd);
  if (SUB168(auVar3 / auVar2,0) < (ulong)(long)(limit + 1)) {
    pvVar4 = (void *)0x0;
    luaG_runerror(L,"memory allocation error: block too big",SUB168(auVar3 % auVar2,0));
  }
  else {
    pvVar4 = luaM_realloc_(L,block,(long)*size * size_elems,(long)limit * size_elems);
  }
  *size = limit;
  return pvVar4;
}

Assistant:

void *luaM_growaux_ (lua_State *L, void *block, int *size, size_t size_elems,
                     int limit, const char *errormsg) {
  void *newblock;
  int newsize;
  if (*size >= limit/2) {  /* cannot double it? */
    if (*size >= limit)  /* cannot grow even a little? */
      luaG_runerror(L, errormsg);
    newsize = limit;  /* still have at least one free place */
  }
  else {
    newsize = (*size)*2;
    if (newsize < MINSIZEARRAY)
      newsize = MINSIZEARRAY;  /* minimum size */
  }
  newblock = luaM_reallocv(L, block, *size, newsize, size_elems);
  *size = newsize;  /* update only when everything else is OK */
  return newblock;
}